

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_rpm.c
# Opt level: O2

ssize_t rpm_filter_read(archive_read_filter *self,void **buff)

{
  long *plVar1;
  long *plVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  char *__src;
  ulong uVar5;
  ssize_t request;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long *plVar9;
  long lStack_80;
  ssize_t avail_in;
  long *local_68;
  long *local_60;
  archive_read_filter *local_58;
  void **local_50;
  void *local_48;
  long *local_40;
  long *local_38;
  
  plVar9 = (long *)self->data;
  *buff = (void *)0x0;
  avail_in = 0;
  local_68 = plVar9 + 1;
  local_38 = plVar9 + 3;
  local_40 = plVar9 + 4;
  local_48 = (void *)((long)plVar9 + 0x24);
  __src = (char *)0x0;
  uVar8 = 0;
  local_60 = plVar9;
  local_58 = self;
  local_50 = buff;
  do {
    if ((__src == (char *)0x0) &&
       (__src = (char *)__archive_read_filter_ahead(self->upstream,1,&avail_in),
       __src == (char *)0x0)) {
      return avail_in >> 0x3f & 0xffffffffffffffe2;
    }
    plVar2 = local_38;
    plVar1 = local_68;
    request = avail_in;
    uVar5 = uVar8;
    switch((int)plVar9[5]) {
    case 0:
      if (*plVar9 + avail_in < 0x60) {
        uVar5 = uVar8 + avail_in;
      }
      else {
        lVar7 = 0x60 - *plVar9;
        __src = __src + lVar7;
        *(undefined4 *)(plVar9 + 5) = 1;
        *local_68 = 0;
        local_68[1] = 0;
        *(undefined4 *)((long)plVar9 + 0x2c) = 1;
        uVar5 = uVar8 + lVar7;
      }
      break;
    case 1:
      uVar5 = 0x10 - *local_68;
      uVar6 = avail_in - uVar8;
      if (uVar5 < avail_in - uVar8) {
        uVar6 = uVar5;
      }
      memcpy((void *)(*local_68 + (long)local_38),__src,uVar6);
      self = local_58;
      plVar9 = local_60;
      __src = __src + uVar6;
      uVar5 = uVar8 + uVar6;
      lVar7 = uVar6 + *plVar1;
      *plVar1 = lVar7;
      if (lVar7 == 0x10) {
        if (((((char)*plVar2 == -0x72) && (*(char *)((long)local_60 + 0x19) == -0x53)) &&
            (*(char *)((long)local_60 + 0x1a) == -0x18)) &&
           (*(char *)((long)local_60 + 0x1b) == '\x01')) {
          uVar3 = archive_be32dec(local_40);
          uVar4 = archive_be32dec(local_48);
          plVar9[2] = (ulong)(uVar4 + uVar3 * 0x10 + 0x10);
          plVar9[5] = 2;
          break;
        }
        if (*(int *)((long)local_60 + 0x2c) != 0) {
          archive_set_error(&local_58->archive->archive,0x54,"Unrecoginized rpm header");
          return -0x1e;
        }
        *(undefined4 *)(local_60 + 5) = 4;
        *local_50 = plVar2;
        lStack_80 = 0x10;
      }
      else {
        lStack_80 = 0;
      }
      goto LAB_003422aa;
    case 2:
      uVar5 = plVar9[2] - plVar9[1];
      uVar6 = avail_in - uVar8;
      if (uVar5 < avail_in - uVar8) {
        uVar6 = uVar5;
      }
      __src = __src + uVar6;
      lVar7 = uVar6 + plVar9[1];
      plVar9[1] = lVar7;
      uVar5 = uVar8 + uVar6;
      if (lVar7 == plVar9[2]) {
        *(undefined4 *)(plVar9 + 5) = 3;
      }
      break;
    case 3:
      uVar5 = avail_in;
      if ((ulong)avail_in < uVar8) {
        uVar5 = uVar8;
      }
      for (; uVar8 < (ulong)avail_in; uVar8 = uVar8 + 1) {
        if (*__src != '\0') {
          *(undefined4 *)(plVar9 + 5) = 1;
          *local_68 = 0;
          local_68[1] = 0;
          uVar5 = uVar8;
          goto switchD_003420ff_default;
        }
        __src = __src + 1;
      }
      lStack_80 = 0;
      goto LAB_003422aa;
    case 4:
      *local_50 = __src;
      lStack_80 = avail_in;
      goto LAB_003422af;
    }
switchD_003420ff_default:
    lStack_80 = 0;
LAB_003422aa:
    if (uVar5 == request) {
LAB_003422af:
      *plVar9 = *plVar9 + request;
      __archive_read_filter_consume(self->upstream,request);
      uVar5 = 0;
      __src = (char *)0x0;
      request = avail_in;
    }
    if ((lStack_80 != 0) || (uVar8 = uVar5, request < 1)) {
      if ((uVar5 != 0) && (__src != (char *)0x0)) {
        *plVar9 = *plVar9 + uVar5;
        __archive_read_filter_consume(self->upstream,uVar5);
      }
      return lStack_80;
    }
  } while( true );
}

Assistant:

static ssize_t
rpm_filter_read(struct archive_read_filter *self, const void **buff)
{
	struct rpm *rpm;
	const unsigned char *b;
	ssize_t avail_in, total;
	size_t used, n;
	uint32_t section;
	uint32_t bytes;

	rpm = (struct rpm *)self->data;
	*buff = NULL;
	total = avail_in = 0;
	b = NULL;
	used = 0;
	do {
		if (b == NULL) {
			b = __archive_read_filter_ahead(self->upstream, 1,
			    &avail_in);
			if (b == NULL) {
				if (avail_in < 0)
					return (ARCHIVE_FATAL);
				else
					break;
			}
		}

		switch (rpm->state) {
		case ST_LEAD:
			if (rpm->total_in + avail_in < RPM_LEAD_SIZE)
				used += avail_in;
			else {
				n = (size_t)(RPM_LEAD_SIZE - rpm->total_in);
				used += n;
				b += n;
				rpm->state = ST_HEADER;
				rpm->hpos = 0;
				rpm->hlen = 0;
				rpm->first_header = 1;
			}
			break;
		case ST_HEADER:
			n = 16 - rpm->hpos;
			if (n > avail_in - used)
				n = avail_in - used;
			memcpy(rpm->header+rpm->hpos, b, n);
			b += n;
			used += n;
			rpm->hpos += n;

			if (rpm->hpos == 16) {
				if (rpm->header[0] != 0x8e ||
				    rpm->header[1] != 0xad ||
				    rpm->header[2] != 0xe8 ||
				    rpm->header[3] != 0x01) {
					if (rpm->first_header) {
						archive_set_error(
						    &self->archive->archive,
						    ARCHIVE_ERRNO_FILE_FORMAT,
						    "Unrecoginized rpm header");
						return (ARCHIVE_FATAL);
					}
					rpm->state = ST_ARCHIVE;
					*buff = rpm->header;
					total = rpm->hpos;
					break;
				}
				/* Calculate 'Header' length. */
				section = archive_be32dec(rpm->header+8);
				bytes = archive_be32dec(rpm->header+12);
				rpm->hlen = 16 + section * 16 + bytes;
				rpm->state = ST_HEADER_DATA;
				rpm->first_header = 0;
			}
			break;
		case ST_HEADER_DATA:
			n = rpm->hlen - rpm->hpos;
			if (n > avail_in - used)
				n = avail_in - used;
			b += n;
			used += n;
			rpm->hpos += n;
			if (rpm->hpos == rpm->hlen)
				rpm->state = ST_PADDING;
			break;
		case ST_PADDING:
			while (used < (size_t)avail_in) {
				if (*b != 0) {
					/* Read next header. */
					rpm->state = ST_HEADER;
					rpm->hpos = 0;
					rpm->hlen = 0;
					break;
				}
				b++;
				used++;
			}
			break;
		case ST_ARCHIVE:
			*buff = b;
			total = avail_in;
			used = avail_in;
			break;
		}
		if (used == (size_t)avail_in) {
			rpm->total_in += used;
			__archive_read_filter_consume(self->upstream, used);
			b = NULL;
			used = 0;
		}
	} while (total == 0 && avail_in > 0);

	if (used > 0 && b != NULL) {
		rpm->total_in += used;
		__archive_read_filter_consume(self->upstream, used);
	}
	return (total);
}